

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O0

int glu::getNumStencilBits(TextureFormat *format)

{
  int *piVar1;
  Vector<int,_4> local_40;
  Vector<int,_4> local_30;
  TextureFormat local_20;
  TextureFormat stencilOnlyFormat;
  TextureFormat *format_local;
  
  stencilOnlyFormat = (TextureFormat)format;
  if (format->order == DS) {
    local_20 = tcu::getEffectiveDepthStencilTextureFormat(format,MODE_STENCIL);
    tcu::getTextureFormatBitDepth((tcu *)&local_30,&local_20);
    piVar1 = tcu::Vector<int,_4>::x(&local_30);
    format_local._4_4_ = *piVar1;
  }
  else if (format->order == S) {
    tcu::getTextureFormatBitDepth((tcu *)&local_40,format);
    piVar1 = tcu::Vector<int,_4>::x(&local_40);
    format_local._4_4_ = *piVar1;
  }
  else {
    format_local._4_4_ = 0;
  }
  return format_local._4_4_;
}

Assistant:

static int getNumStencilBits (const tcu::TextureFormat& format)
{
	if (format.order == tcu::TextureFormat::DS)
	{
		const tcu::TextureFormat	stencilOnlyFormat		= tcu::getEffectiveDepthStencilTextureFormat(format, tcu::Sampler::MODE_STENCIL);
		return tcu::getTextureFormatBitDepth(stencilOnlyFormat).x();
	}
	else if (format.order == tcu::TextureFormat::S)
		return tcu::getTextureFormatBitDepth(format).x();
	else
		return 0;
}